

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O3

void tvm::runtime::LoadMetaDataFromFile
               (string *file_name,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
               *fmap)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string version;
  JSONObjectReadHelper helper;
  JSONReader reader;
  ifstream fs;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
  local_3d8;
  undefined1 local_3a8 [24];
  pointer local_390;
  pointer puStack_388;
  pointer local_380;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream((istream *)local_220,(file_name->_M_dataplus)._M_p,_S_in);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_3a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/file_util.cc"
               ,0xa0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3a8,"Check failed: !fs.fail()",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3a8,"Cannot open file ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3a8,(file_name->_M_dataplus)._M_p,file_name->_M_string_length);
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_3a8);
  }
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  local_3a8._8_8_ = 0;
  local_3a8._16_8_ = 0;
  local_390 = (pointer)0x0;
  puStack_388 = (pointer)0x0;
  local_380 = (pointer)0x0;
  local_3d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3d8._M_impl.super__Rb_tree_header._M_header;
  local_3d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &local_418.field_2;
  local_418._M_dataplus._M_p = (pointer)paVar1;
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_3d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3a8._0_8_ = (istream *)local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"tvm_version","");
  dmlc::JSONObjectReadHelper::DeclareFieldInternal<std::__cxx11::string>
            ((JSONObjectReadHelper *)&local_3d8,&local_418,&local_3f8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != paVar1) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  local_418._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"func_info","");
  dmlc::JSONObjectReadHelper::
  DeclareFieldInternal<std::unordered_map<std::__cxx11::string,tvm::runtime::FunctionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tvm::runtime::FunctionInfo>>>>
            ((JSONObjectReadHelper *)&local_3d8,&local_418,fmap,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != paVar1) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  dmlc::JSONObjectReadHelper::ReadAllFields
            ((JSONObjectReadHelper *)&local_3d8,(JSONReader *)local_3a8);
  std::ifstream::close();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
  ::~_Rb_tree(&local_3d8);
  if (local_390 != (pointer)0x0) {
    operator_delete(local_390,(long)local_380 - (long)local_390);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                             local_3f8.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void LoadMetaDataFromFile(
    const std::string &file_name,
    std::unordered_map<std::string, FunctionInfo> *fmap) {
  std::ifstream fs(file_name.c_str());
  CHECK(!fs.fail()) << "Cannot open file " << file_name;
  std::string version;
  dmlc::JSONReader reader(&fs);
  dmlc::JSONObjectReadHelper helper;
  helper.DeclareField("tvm_version", &version);
  helper.DeclareField("func_info", fmap);
  helper.ReadAllFields(&reader);
  fs.close();
}